

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits,uint32_t page_size)

{
  char *__s;
  Offset OVar1;
  Module *this_00;
  uint64_t uVar2;
  size_t sVar3;
  pointer *__ptr;
  __uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar3 = strlen(__s);
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
  super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl =
       (tuple<wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>)
       operator_new(0x80);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x18) = sVar3;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                   .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x20) =
       __s;
  *(Offset *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x28) = OVar1;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x38) = 7;
  *(undefined ***)
   local_38._M_t.
   super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
   super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl =
       &PTR__MemoryModuleField_001dd828;
  *(long **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                   .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_38._M_t.
                      super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                      .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x50);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x6f) =
       *(undefined4 *)((long)&page_limits->max + 7);
  uVar2 = page_limits->max;
  *(uint64_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x60) =
       page_limits->initial;
  *(uint64_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x68) = uVar2;
  *(uint32_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x78) = page_size;
  this_00 = this->module_;
  if (*(char *)((long)local_38._M_t.
                      super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                      .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x71)
      == '\x01') {
    (this_00->features_used).threads = true;
  }
  Module::AppendField(this_00,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                               *)&local_38);
  if ((_Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
      .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl !=
      (MemoryModuleField *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index,
                                const Limits* page_limits,
                                uint32_t page_size) {
  auto field = std::make_unique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  memory.page_size = page_size;
  if (memory.page_limits.is_shared) {
    module_->features_used.threads = true;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}